

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# units.cpp
# Opt level: O2

string * units::definedUnitsFromFile(string *__return_storage_ptr__,string *filename)

{
  char cVar1;
  istream *piVar2;
  long lVar3;
  long lVar4;
  string *this;
  ulong uVar5;
  bool bVar6;
  precise_measurement meas;
  string userdef;
  string line;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_2b8;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> meas_string;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_278;
  string local_258;
  ifstream infile;
  
  (__return_storage_ptr__->_M_dataplus)._M_p = (pointer)&__return_storage_ptr__->field_2;
  __return_storage_ptr__->_M_string_length = 0;
  (__return_storage_ptr__->field_2)._M_local_buf[0] = '\0';
  std::ifstream::ifstream(&infile,(string *)filename,_S_in);
  cVar1 = std::__basic_file<char>::is_open();
  if (cVar1 != '\0') {
    line._M_dataplus._M_p = (pointer)&line.field_2;
    line._M_string_length = 0;
    line.field_2._M_local_buf[0] = '\0';
LAB_0014a64f:
    do {
      piVar2 = std::getline<char,std::char_traits<char>,std::allocator<char>>
                         ((istream *)&infile,(string *)&line);
      if (((byte)piVar2[*(long *)(*(long *)piVar2 + -0x18) + 0x20] & 5) != 0) goto LAB_0014aa63;
      lVar3 = std::__cxx11::string::find_first_not_of((char *)&line,0x167af9);
      if (lVar3 != -1) {
        cVar1 = line._M_dataplus._M_p[lVar3];
        if (cVar1 == '\'') {
LAB_0014a6a7:
          bVar6 = true;
          while ((bVar6 && (lVar4 = std::__cxx11::string::find
                                              ((char)&line,
                                               (ulong)(uint)(int)line._M_dataplus._M_p[lVar3]),
                           lVar4 != -1))) {
            bVar6 = line._M_dataplus._M_p[lVar4 + -1] == '\\';
            if (bVar6) {
              std::__cxx11::string::erase((ulong)&line,lVar4 - 1);
            }
          }
        }
        else {
          if (cVar1 == '#') goto LAB_0014a64f;
          if (cVar1 == '\"') goto LAB_0014a6a7;
        }
        lVar3 = std::__cxx11::string::find_first_of((char *)&line,0x167afd);
        if (lVar3 == -1) {
          std::operator+(&userdef,&line," is not a valid user defined unit definition\n");
          std::__cxx11::string::append((string *)__return_storage_ptr__);
        }
        else {
          if (lVar3 == line._M_string_length - 1) {
            std::operator+(&userdef,&line," does not have any valid definitions\n");
            std::__cxx11::string::append((string *)__return_storage_ptr__);
            std::__cxx11::string::~string((string *)&userdef);
          }
          if ((byte)(line._M_dataplus._M_p[lVar3 + 1] - 0x3dU) < 2) {
            uVar5 = 1;
          }
          else {
            uVar5 = (ulong)(line._M_dataplus._M_p[lVar3 + -1] == '<');
            if (line._M_dataplus._M_p[lVar3 + -1] == '<') {
              lVar3 = lVar3 + -1;
            }
          }
          std::__cxx11::string::substr((ulong)&userdef,(ulong)&line);
          while (userdef._M_dataplus._M_p[userdef._M_string_length - 1] == ' ') {
            std::__cxx11::string::pop_back();
          }
          cVar1 = *userdef._M_dataplus._M_p;
          if (((cVar1 == '\'') || (cVar1 == '\"')) &&
             (userdef._M_dataplus._M_p[userdef._M_string_length - 1] == cVar1)) {
            std::__cxx11::string::pop_back();
            std::__cxx11::string::erase(&userdef,userdef._M_dataplus._M_p);
          }
          if (userdef._M_string_length == 0) {
            std::operator+(&meas_string,&line," does not specify a user string\n");
            std::__cxx11::string::append((string *)__return_storage_ptr__);
          }
          else {
            lVar4 = std::__cxx11::string::find_first_not_of((char *)&line,0x167b76);
            if (lVar4 == -1) {
              std::operator+(&meas_string,&line," does not specify a unit definition string\n");
              std::__cxx11::string::append((string *)__return_storage_ptr__);
            }
            else {
              std::__cxx11::string::substr((ulong)&meas_string,(ulong)&line);
              while (meas_string._M_dataplus._M_p[meas_string._M_string_length - 1] == ' ') {
                std::__cxx11::string::pop_back();
              }
              cVar1 = *meas_string._M_dataplus._M_p;
              if (((cVar1 == '\'') || (cVar1 == '\"')) &&
                 (meas_string._M_dataplus._M_p[meas_string._M_string_length - 1] == cVar1)) {
                std::__cxx11::string::pop_back();
                std::__cxx11::string::erase(&meas_string,meas_string._M_dataplus._M_p);
              }
              std::__cxx11::string::string((string *)&local_258,(string *)&meas_string);
              measurement_from_string(&meas,&local_258,defaultMatchFlags);
              std::__cxx11::string::~string((string *)&local_258);
              bVar6 = is_valid(&meas);
              if (bVar6) {
                if (line._M_dataplus._M_p[uVar5 + lVar3] == '>') {
                  local_2b8._M_dataplus._M_p = (pointer)(meas.value_ * meas.units_.multiplier_);
                  local_2b8._M_string_length._0_4_ = meas.units_.base_units_;
                  local_2b8._M_string_length._4_4_ = meas.units_.commodity_;
                  addUserDefinedInputUnit(&userdef,(precise_unit *)&local_2b8);
                }
                else if (line._M_dataplus._M_p[lVar3] == '<') {
                  local_2b8._M_dataplus._M_p = (pointer)(meas.value_ * meas.units_.multiplier_);
                  local_2b8._M_string_length._0_4_ = meas.units_.base_units_;
                  local_2b8._M_string_length._4_4_ = meas.units_.commodity_;
                  addUserDefinedOutputUnit(&userdef,(precise_unit *)&local_2b8);
                }
                else {
                  local_2b8._M_dataplus._M_p = (pointer)(meas.value_ * meas.units_.multiplier_);
                  local_2b8._M_string_length._0_4_ = meas.units_.base_units_;
                  local_2b8._M_string_length._4_4_ = meas.units_.commodity_;
                  addUserDefinedUnit(&userdef,(precise_unit *)&local_2b8);
                }
              }
              else {
                std::__cxx11::string::substr((ulong)&local_278,(ulong)&line);
                std::operator+(&local_2b8,&local_278," does not generate a valid unit\n");
                std::__cxx11::string::append((string *)__return_storage_ptr__);
                std::__cxx11::string::~string((string *)&local_2b8);
                std::__cxx11::string::~string((string *)&local_278);
              }
            }
          }
          std::__cxx11::string::~string((string *)&meas_string);
        }
        std::__cxx11::string::~string((string *)&userdef);
      }
    } while( true );
  }
  std::operator+(&userdef,"unable to read file ",filename);
  std::operator+(&line,&userdef,"\n");
  std::__cxx11::string::operator=((string *)__return_storage_ptr__,(string *)&line);
  std::__cxx11::string::~string((string *)&line);
  this = &userdef;
LAB_0014aa68:
  std::__cxx11::string::~string((string *)this);
  std::ifstream::~ifstream(&infile);
  return __return_storage_ptr__;
LAB_0014aa63:
  this = &line;
  goto LAB_0014aa68;
}

Assistant:

std::string definedUnitsFromFile(const std::string& filename) noexcept
{
    std::string output;
    try {
        std::ifstream infile(filename);
        if (!infile.is_open()) {
            output = "unable to read file " + filename + "\n";
            return output;
        }
        std::string line;
        while (std::getline(infile, line)) {
            auto commentloc = line.find_first_not_of(" \t\n");
            if (commentloc == std::string::npos || line[commentloc] == '#') {
                continue;
            }
            std::size_t esep{1};  // extra separation location to handle quotes
            if (line[commentloc] == '\"' || line[commentloc] == '\'') {
                bool notfound{true};
                while (notfound) {
                    esep =
                        line.find_first_of(line[commentloc], commentloc + esep);
                    if (esep == std::string::npos) {
                        esep = 1;
                        break;
                    }
                    if (line[esep - 1] != '\\') {
                        notfound = false;
                    } else {
                        // remove the escaped quote
                        line.erase(esep - 1, 1);
                    }
                    esep -= commentloc;
                }
            }
            auto sep = line.find_first_of(",;=", commentloc + esep);
            if (sep == std::string::npos) {
                output +=
                    line + " is not a valid user defined unit definition\n";
                continue;
            }
            if (sep == line.size() - 1) {
                output += line + " does not have any valid definitions\n";
            }
            int length{0};
            if (line[sep + 1] == '=' || line[sep + 1] == '>') {
                length = 1;
            }
            if (length == 0 && line[sep - 1] == '<') {
                length = 1;
                --sep;
            }
            // get the new definition name
            std::string userdef = line.substr(commentloc, sep - commentloc);
            while (userdef.back() == ' ') {
                userdef.pop_back();
            }
            // remove quotes
            if ((userdef.front() == '\"' || userdef.front() == '\'') &&
                userdef.back() == userdef.front()) {
                userdef.pop_back();
                userdef.erase(userdef.begin());
            }
            if (userdef.empty()) {
                output += line + " does not specify a user string\n";
                continue;
            }
            // the unit string
            auto sloc = line.find_first_not_of(" \t", sep + length + 1);
            if (sloc == std::string::npos) {
                output += line + " does not specify a unit definition string\n";
                continue;
            }
            auto meas_string = line.substr(sloc);
            while (meas_string.back() == ' ') {
                meas_string.pop_back();
            }
            if ((meas_string.front() == '\"' || meas_string.front() == '\'') &&
                meas_string.back() == meas_string.front()) {
                meas_string.pop_back();
                meas_string.erase(meas_string.begin());
            }
            auto meas = measurement_from_string(meas_string);
            if (!is_valid(meas)) {
                output +=
                    line.substr(sloc) + " does not generate a valid unit\n";
                continue;
            }

            if (line[sep + length] == '>') {
                addUserDefinedInputUnit(userdef, meas.as_unit());
            } else if (line[sep] == '<') {
                addUserDefinedOutputUnit(userdef, meas.as_unit());
            } else {
                addUserDefinedUnit(userdef, meas.as_unit());
            }
        }
    }
    // LCOV_EXCL_START
    catch (const std::exception& e) {
        output += e.what();
        output.push_back('\n');
        // this is mainly just to catch any weird errors coming from somewhere
        // so this function can be noexcept
    }
    // LCOV_EXCL_STOP
    return output;
}